

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86.cpp
# Opt level: O2

int __thiscall ncnn::LSTM_x86::create_pipeline(LSTM_x86 *this,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  void *pvVar14;
  int *piVar15;
  Allocator *pAVar16;
  int _w;
  void *pvVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  void *pvVar21;
  ulong uVar22;
  void *pvVar23;
  void *pvVar24;
  void *pvVar25;
  void *pvVar26;
  void *pvVar27;
  ulong uVar28;
  undefined4 *puVar29;
  long lVar30;
  void *pvVar31;
  void *pvVar32;
  long lVar33;
  void *pvVar34;
  long lVar35;
  long lVar36;
  void *pvVar37;
  void *pvVar38;
  void *pvVar39;
  void *pvVar40;
  void *pvVar41;
  ulong uVar42;
  uint _c;
  void *pvVar43;
  void *pvVar44;
  void *pvVar45;
  long lVar46;
  void *local_158;
  void *local_150;
  
  if ((this->super_LSTM).int8_scale_term == 0) {
    _c = ((this->super_LSTM).direction == 2) + 1;
    uVar42 = (long)(this->super_LSTM).weight_data_size / (long)(int)_c;
    iVar1 = (this->super_LSTM).hidden_size;
    uVar42 = (long)((ulong)(uint)((int)uVar42 >> 0x1f) << 0x20 | uVar42 & 0xffffffff) / (long)iVar1;
    uVar42 = (long)((ulong)(uint)((int)uVar42 >> 0x1f) << 0x20 | uVar42 & 0xffffffff) / 4;
    _w = (int)uVar42;
    uVar42 = uVar42 & 0xffffffff;
    Mat::create(&this->weight_xc_data_packed,_w,iVar1,_c,0x10,4,(Allocator *)0x0);
    Mat::create(&this->bias_c_data_packed,(this->super_LSTM).hidden_size,1,_c,0x10,4,
                (Allocator *)0x0);
    Mat::create(&this->weight_hc_data_packed,(this->super_LSTM).num_output,
                (this->super_LSTM).hidden_size,_c,0x10,4,(Allocator *)0x0);
    sVar4 = (this->super_LSTM).weight_xc_data.elemsize;
    sVar5 = (this->super_LSTM).bias_c_data.elemsize;
    sVar6 = (this->super_LSTM).bias_c_data.cstep;
    iVar1 = (this->weight_xc_data_packed).w;
    sVar7 = (this->weight_xc_data_packed).elemsize;
    sVar8 = (this->bias_c_data_packed).cstep;
    sVar9 = (this->bias_c_data_packed).elemsize;
    iVar2 = (this->weight_hc_data_packed).w;
    sVar10 = (this->weight_hc_data_packed).elemsize;
    lVar35 = (long)(this->super_LSTM).bias_c_data.w * sVar5;
    uVar3 = (this->super_LSTM).hidden_size;
    if (_w < 1) {
      uVar42 = 0;
    }
    uVar28 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar28 = 0;
    }
    lVar30 = (long)(this->super_LSTM).weight_xc_data.w * sVar4;
    sVar11 = (this->weight_xc_data_packed).cstep;
    sVar12 = (this->weight_hc_data_packed).cstep;
    pvVar41 = (this->super_LSTM).weight_xc_data.data;
    pvVar17 = (void *)(lVar30 * (int)(uVar3 * 3) + (long)pvVar41);
    lVar33 = sVar4 * (this->super_LSTM).weight_xc_data.cstep;
    local_150 = (void *)(lVar30 * (int)(uVar3 * 2) + (long)pvVar41);
    local_158 = (void *)(lVar30 * (int)uVar3 + (long)pvVar41);
    sVar4 = (this->super_LSTM).weight_hc_data.elemsize;
    lVar18 = (long)(this->super_LSTM).weight_hc_data.w * sVar4;
    pvVar32 = (this->super_LSTM).weight_hc_data.data;
    pvVar26 = (void *)((int)(uVar3 * 3) * lVar18 + (long)pvVar32);
    lVar20 = sVar4 * (this->super_LSTM).weight_hc_data.cstep;
    pvVar23 = (void *)((int)(uVar3 * 2) * lVar18 + (long)pvVar32);
    pvVar45 = (void *)((int)uVar3 * lVar18 + (long)pvVar32);
    pvVar13 = (this->super_LSTM).bias_c_data.data;
    pvVar39 = (this->weight_xc_data_packed).data;
    pvVar14 = (this->bias_c_data_packed).data;
    pvVar44 = (this->weight_hc_data_packed).data;
    for (uVar22 = 0; uVar22 != _c; uVar22 = uVar22 + 1) {
      lVar36 = sVar6 * sVar5 * uVar22;
      puVar29 = (undefined4 *)(sVar8 * sVar9 * uVar22 + (long)pvVar14);
      uVar3 = (this->super_LSTM).num_output;
      if ((int)uVar3 < 1) {
        uVar3 = 0;
      }
      pvVar21 = pvVar45;
      pvVar24 = pvVar41;
      pvVar25 = pvVar32;
      pvVar27 = local_150;
      pvVar31 = pvVar23;
      pvVar34 = pvVar17;
      pvVar37 = pvVar26;
      pvVar38 = pvVar39;
      pvVar40 = local_158;
      pvVar43 = pvVar44;
      for (uVar19 = 0; uVar19 != uVar28; uVar19 = uVar19 + 1) {
        *puVar29 = *(undefined4 *)((long)pvVar13 + uVar19 * 4 + lVar36);
        puVar29[1] = *(undefined4 *)((long)pvVar13 + uVar19 * 4 + lVar35 + lVar36);
        puVar29[2] = *(undefined4 *)((long)pvVar13 + uVar19 * 4 + lVar35 * 2 + lVar36);
        puVar29[3] = *(undefined4 *)((long)pvVar13 + uVar19 * 4 + lVar35 * 3 + lVar36);
        for (lVar46 = 0; uVar42 * 4 != lVar46; lVar46 = lVar46 + 4) {
          *(undefined4 *)((long)pvVar38 + lVar46 * 4) = *(undefined4 *)((long)pvVar24 + lVar46);
          *(undefined4 *)((long)pvVar38 + lVar46 * 4 + 4) = *(undefined4 *)((long)pvVar40 + lVar46);
          *(undefined4 *)((long)pvVar38 + lVar46 * 4 + 8) = *(undefined4 *)((long)pvVar27 + lVar46);
          *(undefined4 *)((long)pvVar38 + lVar46 * 4 + 0xc) =
               *(undefined4 *)((long)pvVar34 + lVar46);
        }
        for (lVar46 = 0; (ulong)uVar3 * 4 != lVar46; lVar46 = lVar46 + 4) {
          *(undefined4 *)((long)pvVar43 + lVar46 * 4) = *(undefined4 *)((long)pvVar25 + lVar46);
          *(undefined4 *)((long)pvVar43 + lVar46 * 4 + 4) = *(undefined4 *)((long)pvVar21 + lVar46);
          *(undefined4 *)((long)pvVar43 + lVar46 * 4 + 8) = *(undefined4 *)((long)pvVar31 + lVar46);
          *(undefined4 *)((long)pvVar43 + lVar46 * 4 + 0xc) =
               *(undefined4 *)((long)pvVar37 + lVar46);
        }
        puVar29 = puVar29 + 4;
        pvVar34 = (void *)((long)pvVar34 + lVar30);
        pvVar27 = (void *)((long)pvVar27 + lVar30);
        pvVar40 = (void *)((long)pvVar40 + lVar30);
        pvVar24 = (void *)((long)pvVar24 + lVar30);
        pvVar38 = (void *)((long)pvVar38 + (long)iVar1 * sVar7);
        pvVar37 = (void *)((long)pvVar37 + lVar18);
        pvVar31 = (void *)((long)pvVar31 + lVar18);
        pvVar21 = (void *)((long)pvVar21 + lVar18);
        pvVar25 = (void *)((long)pvVar25 + lVar18);
        pvVar43 = (void *)((long)pvVar43 + (long)iVar2 * sVar10);
      }
      pvVar17 = (void *)((long)pvVar17 + lVar33);
      local_150 = (void *)((long)local_150 + lVar33);
      local_158 = (void *)((long)local_158 + lVar33);
      pvVar41 = (void *)((long)pvVar41 + lVar33);
      pvVar39 = (void *)((long)pvVar39 + sVar11 * sVar7);
      pvVar26 = (void *)((long)pvVar26 + lVar20);
      pvVar23 = (void *)((long)pvVar23 + lVar20);
      pvVar45 = (void *)((long)pvVar45 + lVar20);
      pvVar32 = (void *)((long)pvVar32 + lVar20);
      pvVar44 = (void *)((long)pvVar44 + sVar12 * sVar10);
    }
    if (opt->lightmode != false) {
      piVar15 = (this->super_LSTM).weight_xc_data.refcount;
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          pAVar16 = (this->super_LSTM).weight_xc_data.allocator;
          if (pAVar16 == (Allocator *)0x0) {
            free((this->super_LSTM).weight_xc_data.data);
          }
          else {
            (*pAVar16->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_LSTM).weight_xc_data.cstep = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.refcount + 4) = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.elemsize + 4) = 0;
      (this->super_LSTM).weight_xc_data.data = (void *)0x0;
      (this->super_LSTM).weight_xc_data.refcount = (int *)0x0;
      (this->super_LSTM).weight_xc_data.c = 0;
      (this->super_LSTM).weight_xc_data.dims = 0;
      (this->super_LSTM).weight_xc_data.w = 0;
      (this->super_LSTM).weight_xc_data.h = 0;
      (this->super_LSTM).weight_xc_data.d = 0;
      piVar15 = (this->super_LSTM).bias_c_data.refcount;
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          pAVar16 = (this->super_LSTM).bias_c_data.allocator;
          if (pAVar16 == (Allocator *)0x0) {
            free((this->super_LSTM).bias_c_data.data);
          }
          else {
            (*pAVar16->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_LSTM).bias_c_data.cstep = 0;
      *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.refcount + 4) = 0;
      *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.elemsize + 4) = 0;
      (this->super_LSTM).bias_c_data.data = (void *)0x0;
      (this->super_LSTM).bias_c_data.refcount = (int *)0x0;
      (this->super_LSTM).bias_c_data.c = 0;
      (this->super_LSTM).bias_c_data.dims = 0;
      (this->super_LSTM).bias_c_data.w = 0;
      (this->super_LSTM).bias_c_data.h = 0;
      (this->super_LSTM).bias_c_data.d = 0;
      piVar15 = (this->super_LSTM).weight_hc_data.refcount;
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          pAVar16 = (this->super_LSTM).weight_hc_data.allocator;
          if (pAVar16 == (Allocator *)0x0) {
            free((this->super_LSTM).weight_hc_data.data);
          }
          else {
            (*pAVar16->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_LSTM).weight_hc_data.cstep = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.refcount + 4) = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.elemsize + 4) = 0;
      (this->super_LSTM).weight_hc_data.data = (void *)0x0;
      (this->super_LSTM).weight_hc_data.refcount = (int *)0x0;
      (this->super_LSTM).weight_hc_data.dims = 0;
      (this->super_LSTM).weight_hc_data.w = 0;
      (this->super_LSTM).weight_hc_data.h = 0;
      (this->super_LSTM).weight_hc_data.d = 0;
      (this->super_LSTM).weight_hc_data.c = 0;
    }
  }
  else {
    create_pipeline_int8(this,opt);
  }
  return 0;
}

Assistant:

int LSTM_x86::create_pipeline(const Option& opt)
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return create_pipeline_int8(opt);
    }
#endif

    // pack IFOG
    int num_directions = direction == 2 ? 2 : 1;
    int size = weight_data_size / num_directions / hidden_size / 4;

#if __AVX__
    weight_xc_data_packed.create(size, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
#else
    weight_xc_data_packed.create(size, hidden_size, num_directions, 16u, 4);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size, num_directions, 16u, 4);
#endif

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int dr = 0; dr < num_directions; dr++)
    {
        const Mat weight_xc = weight_xc_data.channel(dr);
        const Mat bias_c = bias_c_data.channel(dr);
        const Mat weight_hc = weight_hc_data.channel(dr);

        Mat weight_xc_data_packed_dr = weight_xc_data_packed.channel(dr);
        Mat bias_c_data_packed_dr = bias_c_data_packed.channel(dr);
        Mat weight_hc_data_packed_dr = weight_hc_data_packed.channel(dr);

        const float* bias_c_I = bias_c.row(0);
        const float* bias_c_F = bias_c.row(1);
        const float* bias_c_O = bias_c.row(2);
        const float* bias_c_G = bias_c.row(3);

        float* bias_c_IFOG = bias_c_data_packed_dr.row(0);

        int q = 0;
#if __AVX__
        for (; q + 1 < hidden_size; q += 2)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];
            bias_c_IFOG[4] = bias_c_I[q + 1];
            bias_c_IFOG[5] = bias_c_F[q + 1];
            bias_c_IFOG[6] = bias_c_O[q + 1];
            bias_c_IFOG[7] = bias_c_G[q + 1];

            bias_c_IFOG += 8;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);
            const float* weight_xc_I_1 = weight_xc.row(hidden_size * 0 + q + 1);
            const float* weight_xc_F_1 = weight_xc.row(hidden_size * 1 + q + 1);
            const float* weight_xc_O_1 = weight_xc.row(hidden_size * 2 + q + 1);
            const float* weight_xc_G_1 = weight_xc.row(hidden_size * 3 + q + 1);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);
            const float* weight_hc_I_1 = weight_hc.row(hidden_size * 0 + q + 1);
            const float* weight_hc_F_1 = weight_hc.row(hidden_size * 1 + q + 1);
            const float* weight_hc_O_1 = weight_hc.row(hidden_size * 2 + q + 1);
            const float* weight_hc_G_1 = weight_hc.row(hidden_size * 3 + q + 1);

            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2);

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];
                weight_xc_IFOG[4] = weight_xc_I_1[i];
                weight_xc_IFOG[5] = weight_xc_F_1[i];
                weight_xc_IFOG[6] = weight_xc_O_1[i];
                weight_xc_IFOG[7] = weight_xc_G_1[i];

                weight_xc_IFOG += 8;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];
                weight_hc_IFOG[4] = weight_hc_I_1[i];
                weight_hc_IFOG[5] = weight_hc_F_1[i];
                weight_hc_IFOG[6] = weight_hc_O_1[i];
                weight_hc_IFOG[7] = weight_hc_G_1[i];

                weight_hc_IFOG += 8;
            }
        }
#endif // __AVX__
        for (; q < hidden_size; q++)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];

            bias_c_IFOG += 4;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);

#if __AVX__
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2 + q % 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2 + q % 2);
#else
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q);
#endif

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];

                weight_xc_IFOG += 4;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];

                weight_hc_IFOG += 4;
            }
        }
    }

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
    }

    return 0;
}